

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O1

strbuf * strbuf_new_for_agent_query(void)

{
  size_t sVar1;
  strbuf *psVar2;
  uchar *puVar3;
  
  psVar2 = strbuf_new_general(false);
  puVar3 = (uchar *)safegrowarray(psVar2->s,(size_t *)&psVar2[-1].binarysink_[0].binarysink_,1,
                                  psVar2->len + 1,4,*(_Bool *)&psVar2[1].s);
  psVar2->s = (char *)puVar3;
  psVar2->u = puVar3;
  sVar1 = psVar2->len;
  psVar2->len = sVar1 + 4;
  puVar3[sVar1 + 4] = '\0';
  return psVar2;
}

Assistant:

strbuf *strbuf_new_for_agent_query(void)
{
    strbuf *buf = strbuf_new();
    strbuf_append(buf, 4);
    return buf;
}